

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

size_t secp256k1_context_preallocated_size(uint flags)

{
  void *in_RSI;
  char *pcVar1;
  
  if ((char)flags == '\x01') {
    return (ulong)((flags & 0x100) << 0xc) | 0xe0;
  }
  pcVar1 = "Invalid flags";
  secp256k1_default_illegal_callback_fn("Invalid flags",in_RSI);
  return (ulong)(*(long *)pcVar1 != 0) << 0x14 | 0xe0;
}

Assistant:

size_t secp256k1_context_preallocated_size(unsigned int flags) {
    size_t ret = ROUND_TO_ALIGN(sizeof(secp256k1_context));
    /* A return value of 0 is reserved as an indicator for errors when we call this function internally. */
    VERIFY_CHECK(ret != 0);

    if (EXPECT((flags & SECP256K1_FLAGS_TYPE_MASK) != SECP256K1_FLAGS_TYPE_CONTEXT, 0)) {
            secp256k1_callback_call(&default_illegal_callback,
                                    "Invalid flags");
            return 0;
    }

    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_SIGN) {
        ret += SECP256K1_ECMULT_GEN_CONTEXT_PREALLOCATED_SIZE;
    }
    if (flags & SECP256K1_FLAGS_BIT_CONTEXT_VERIFY) {
        ret += SECP256K1_ECMULT_CONTEXT_PREALLOCATED_SIZE;
    }
    return ret;
}